

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBox::setModel(QComboBox *this,QAbstractItemModel *model)

{
  QComboBoxPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  QObject *pQVar3;
  long *plVar4;
  void **ppvVar5;
  QCompleter *pQVar6;
  QItemSelectionModel *pQVar7;
  undefined4 *puVar8;
  long lVar9;
  long in_FS_OFFSET;
  code *local_68;
  quintptr local_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_58;
  Connection local_50;
  code *local_48;
  ImplFn local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (model == (QAbstractItemModel *)0x0) {
    setModel();
  }
  else {
    this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
    if (this_00->model != model) {
      if (this_00->lineEdit != (QLineEdit *)0x0) {
        pQVar6 = QLineEdit::completer(this_00->lineEdit);
        if (pQVar6 != (QCompleter *)0x0) {
          pQVar6 = QLineEdit::completer(this_00->lineEdit);
          QCompleter::setModel(pQVar6,model);
        }
      }
      lVar9 = 600;
      do {
        QObject::disconnect((Connection *)
                            (&(this_00->super_QWidgetPrivate).super_QObjectPrivate + lVar9));
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x298);
      pQVar1 = this_00->model;
      if ((pQVar1 != (QAbstractItemModel *)0x0) &&
         (*(QComboBox **)(*(long *)(pQVar1 + 8) + 0x10) == this)) {
        (**(code **)(*(long *)pQVar1 + 0x20))();
      }
      this_00->model = model;
      pDVar2 = (this_00->container).wp.d;
      if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
         (pQVar3 = (this_00->container).wp.value, pQVar3 != (QObject *)0x0)) {
        plVar4 = *(long **)(pQVar3 + 0x50);
        (**(code **)(*plVar4 + 0x1c8))(plVar4,model);
        pQVar7 = QAbstractItemView::selectionModel
                           (*(QAbstractItemView **)((this_00->container).wp.value + 0x50));
        local_68 = QItemSelectionModel::currentChanged;
        local_60 = 0;
        local_48 = QComboBoxPrivate::emitHighlighted;
        local_40 = (ImplFn)0x0;
        ppvVar5 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
        puVar8 = (undefined4 *)operator_new(0x20);
        *puVar8 = 1;
        *(code **)(puVar8 + 2) =
             QtPrivate::
             QPrivateSlotObject<void_(QComboBoxPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
             ::impl;
        *(code **)(puVar8 + 4) = QComboBoxPrivate::emitHighlighted;
        *(undefined8 *)(puVar8 + 6) = 0;
        QObject::connectImpl
                  ((QObject *)&local_50,(void **)pQVar7,(QObject *)&local_68,ppvVar5,
                   (QSlotObjectBase *)&local_48,(ConnectionType)puVar8,(int *)0x80,
                   (QMetaObject *)0x0);
        QMetaObject::Connection::~Connection(&local_50);
      }
      QComboBoxPrivate::connectModel(this_00);
      local_68 = (code *)0xffffffffffffffff;
      local_60 = 0;
      tStack_58.ptr = (QAbstractItemModel *)0x0;
      setRootModelIndex(this,(QModelIndex *)&local_68);
      QComboBoxPrivate::trySetValidIndex(this_00);
      QComboBoxPrivate::modelChanged(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setModel(QAbstractItemModel *model)
{
    Q_D(QComboBox);

    if (Q_UNLIKELY(!model)) {
        qWarning("QComboBox::setModel: cannot set a 0 model");
        return;
    }

    if (model == d->model)
        return;

#if QT_CONFIG(completer)
    if (d->lineEdit && d->lineEdit->completer())
        d->lineEdit->completer()->setModel(model);
#endif
    d->disconnectModel();
    if (d->model && d->model->QObject::parent() == this) {
        delete d->model;
        d->model = nullptr;
    }

    d->model = model;

    if (d->container) {
        d->container->itemView()->setModel(model);
        QObjectPrivate::connect(d->container->itemView()->selectionModel(),
                                &QItemSelectionModel::currentChanged,
                                d, &QComboBoxPrivate::emitHighlighted, Qt::UniqueConnection);
    }

    d->connectModel();

    setRootModelIndex(QModelIndex());

    d->trySetValidIndex();
    d->modelChanged();
}